

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pixel dest [7];
  pixel reference [7];
  pixel_rgbx<agge::order_rgba> local_98;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  undefined1 uStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  undefined1 uStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  undefined1 uStack_89;
  char local_88;
  char local_87;
  char local_86;
  undefined1 uStack_85;
  char local_84;
  char local_83;
  char local_82;
  undefined1 uStack_81;
  undefined1 local_80 [2];
  char local_7e;
  undefined1 uStack_7d;
  string local_78;
  pixel_rgbx<agge::order_rgba> local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  LocationInfo local_38;
  
  cVar1 = color::make('\0','\0','\0',0xff);
  local_98.components[0] = 0xff;
  local_98.components[1] = 0xff;
  local_98.components[2] = 0xff;
  local_98.components[3] = 0xff;
  iVar3 = ((uint)cVar1 >> 0x18) * 0x40 + (((uint)cVar1 >> 0x18) * 0x1f9) / 1000;
  uVar5 = (uint)cVar1 & 0xff;
  uVar2 = (uint)cVar1 >> 8 & 0xff;
  uVar4 = (uint)cVar1 >> 0x10 & 0xff;
  iVar6 = iVar3 * 0x12;
  _cStack_94 = CONCAT13(0xff,CONCAT12((char)((uVar4 - 0xff) * iVar6 >> 0x16) + -1,
                                      CONCAT11((char)((uVar2 - 0xff) * iVar6 >> 0x16) + -1,
                                               (char)((uVar5 - 0xff) * iVar6 >> 0x16) + -1)));
  iVar6 = iVar3 * 0x21;
  _cStack_90 = CONCAT13(0xff,CONCAT12((char)((uVar4 - 0xff) * iVar6 >> 0x16) + -1,
                                      CONCAT11((char)((uVar2 - 0xff) * iVar6 >> 0x16) + -1,
                                               (char)((uVar5 - 0xff) * iVar6 >> 0x16) + -1)));
  iVar6 = iVar3 * 0x71;
  _cStack_8c = CONCAT13(0xff,CONCAT12((char)((uVar4 - 0xff) * iVar6 >> 0x16) + -1,
                                      CONCAT11((char)((uVar2 - 0xff) * iVar6 >> 0x16) + -1,
                                               (char)((uVar5 - 0xff) * iVar6 >> 0x16) + -1)));
  iVar6 = iVar3 * 0x81;
  _local_88 = CONCAT13(0xff,CONCAT12((char)((uVar4 - 0xff) * iVar6 >> 0x16) + -1,
                                     CONCAT11((char)((uVar2 - 0xff) * iVar6 >> 0x16) + -1,
                                              (char)((uVar5 - 0xff) * iVar6 >> 0x16) + -1)));
  iVar6 = iVar3 * 0xf0;
  _local_84 = CONCAT13(0xff,CONCAT12((char)((uVar4 - 0xff) * iVar6 >> 0x16) + -1,
                                     CONCAT11((char)((uVar2 - 0xff) * iVar6 >> 0x16) + -1,
                                              (char)((uVar5 - 0xff) * iVar6 >> 0x16) + -1)));
  if (iVar3 == 0x4040) {
    _local_80 = cVar1._0_3_;
  }
  else {
    iVar3 = iVar3 * 0xff;
    _local_80 = CONCAT12((char)((uVar4 - 0xff) * iVar3 >> 0x16) + -1,
                         CONCAT11((char)((uVar2 - 0xff) * iVar3 >> 0x16) + -1,
                                  (char)((uVar5 - 0xff) * iVar3 >> 0x16) + -1));
  }
  _local_80 = CONCAT13(0xff,_local_80);
  uStack_44 = 0xf0f0f0f;
  local_58.components[0] = 0xff;
  local_58.components[1] = 0xff;
  local_58.components[2] = 0xff;
  local_58.components[3] = 0xff;
  uStack_54 = 0xedededed;
  uStack_50 = 0xdededede;
  uStack_4c = 0x7e7e7e7e8e8e8e8e;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_78,99);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            ((pixel_rgbx<agge::order_rgba> (*) [7])&local_58,
             (pixel_rgbx<agge::order_rgba> (*) [7])&local_98,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel white = { { 0xFF, 0xFF, 0xFF, 0xFF } };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> blackness(color::make(0x00, 0x00, 0x00));
				pixel dest[n];

				fill_n(dest, n, white);

				// ACT
				blackness(dest + 0, 0, 0, 1, covers + 0);
				blackness(dest + 1, 0, 0, 1, covers + 1);
				blackness(dest + 2, 0, 0, 1, covers + 2);
				blackness(dest + 3, 0, 0, 1, covers + 3);
				blackness(dest + 4, 0, 0, 1, covers + 4);
				blackness(dest + 5, 0, 0, 1, covers + 5);
				blackness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
					{ { 0xED, 0xED, 0xED, 0xED } },
					{ { 0xDE, 0xDE, 0xDE, 0xDE } },
					{ { 0x8E, 0x8E, 0x8E, 0x8E } },
					{ { 0x7E, 0x7E, 0x7E, 0x7E } },
					{ { 0x0F, 0x0F, 0x0F, 0x0F } },
					{ { 0x00, 0x00, 0x00, 0x00 } },
				};

				assert_equal(reference, dest);
			}